

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruapu.h
# Opt level: O2

int ruapu_supports(char *isa)

{
  int iVar1;
  char **ppcVar2;
  
  ppcVar2 = g_ruapu_isa_supported;
  do {
    if (*ppcVar2 == (char *)0x0) {
      return 0;
    }
    iVar1 = strcmp(*ppcVar2,isa);
    ppcVar2 = ppcVar2 + 1;
  } while (iVar1 != 0);
  return 1;
}

Assistant:

int ruapu_supports(const char* isa)
{
    const char* const* isa_supported = g_ruapu_isa_supported;
    while (*isa_supported)
    {
        if (strcmp(*isa_supported, isa) == 0)
            return 1;

        isa_supported++;
    }

    return 0;
}